

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

char * findfile(lua_State *L,char *name,char *pname)

{
  char *pcVar1;
  undefined8 in_RDX;
  lua_State *in_RSI;
  lua_State *in_RDI;
  char *path;
  char *in_stack_00001ff8;
  char *in_stack_00002000;
  char *in_stack_00002008;
  char *in_stack_00002010;
  lua_State *in_stack_00002018;
  size_t *in_stack_ffffffffffffffe0;
  
  lua_getfield(L,name._4_4_,pname);
  pcVar1 = lua_tolstring(in_RSI,(int)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffe0);
  if (pcVar1 == (char *)0x0) {
    luaL_error(in_RDI,"\'package.%s\' must be a string",in_RDX);
  }
  pcVar1 = searchpath(in_stack_00002018,in_stack_00002010,in_stack_00002008,in_stack_00002000,
                      in_stack_00001ff8);
  return pcVar1;
}

Assistant:

static const char *findfile(lua_State *L, const char *name,
			    const char *pname)
{
  const char *path;
  lua_getfield(L, LUA_ENVIRONINDEX, pname);
  path = lua_tostring(L, -1);
  if (path == NULL)
    luaL_error(L, LUA_QL("package.%s") " must be a string", pname);
  return searchpath(L, name, path, ".", LUA_DIRSEP);
}